

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.h
# Opt level: O2

void sx_pool_del(sx_pool *pool,void *ptr)

{
  int iVar1;
  sx__pool_page *psVar2;
  uint8_t *puVar3;
  code *pcVar4;
  sx__pool_page **ppsVar5;
  
  ppsVar5 = &pool->pages;
  while( true ) {
    psVar2 = *ppsVar5;
    if (psVar2 == (sx__pool_page *)0x0) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                        ,0xe0,"pointer does not blong to the pool");
      pcVar4 = (code *)swi(3);
      (*pcVar4)();
      return;
    }
    puVar3 = psVar2->buff;
    if ((puVar3 <= ptr) && (ptr < puVar3 + (long)pool->capacity * (long)pool->item_sz)) break;
    ppsVar5 = &psVar2->next;
  }
  if ((ulong)((long)ptr - (long)puVar3) % (ulong)(long)pool->item_sz != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                      ,0xd6,"ptr is not aligned to items, probably invalid");
    pcVar4 = (code *)swi(3);
    (*pcVar4)();
    return;
  }
  iVar1 = psVar2->iter;
  if (iVar1 == pool->capacity) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/include/sx/pool.h"
                      ,0xd8,"cannot delete more objects, possible double delete");
    pcVar4 = (code *)swi(3);
    (*pcVar4)();
    return;
  }
  psVar2->iter = iVar1 + 1;
  psVar2->ptrs[iVar1] = ptr;
  return;
}

Assistant:

SX_INLINE void sx_pool_del(sx_pool* pool, void* ptr)
{
    uintptr_t uptr = (uintptr_t)ptr;
    sx__pool_page* page = pool->pages;
    int item_sz = pool->item_sz;
    int capacity = pool->capacity;

    while (page) {
        if (uptr >= (uintptr_t)page->buff &&
            uptr < (uintptr_t)(page->buff + (size_t)capacity * (size_t)item_sz)) {
            sx_assertf((uintptr_t)((uint8_t*)ptr - page->buff) % item_sz == 0,
                      "ptr is not aligned to items, probably invalid");
            sx_assertf(page->iter != capacity,
                      "cannot delete more objects, possible double delete");

            page->ptrs[page->iter++] = ptr;
            return;
        }

        page = page->next;
    }
    sx_assertf(0, "pointer does not blong to the pool");
}